

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::verify_piece(torrent *this,piece_index_t piece)

{
  uint uVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  undefined4 extraout_var;
  file_storage *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char cVar11;
  char cVar12;
  vector<sha256_hash> hashes;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  pointer pdStack_a0;
  pointer local_98;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> local_68;
  digest32<160L> local_44;
  
  iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [0x2e])();
  iVar10 = session_settings::get_int((session_settings *)CONCAT44(extraout_var,iVar10),0x4024);
  cVar11 = -0x70;
  if (iVar10 != 2) {
    cVar11 = '\0';
  }
  cVar12 = -0x80;
  if (iVar10 != 3) {
    cVar12 = cVar11;
  }
  bVar9 = info_hash_t::has_v1(&((this->super_torrent_hot_members).m_torrent_file.
                                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->m_info_hash);
  cVar11 = cVar12 + ' ';
  if (!bVar9) {
    cVar11 = cVar12;
  }
  hashes.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hashes.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  hashes.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar9 = info_hash_t::has_v2(&((this->super_torrent_hot_members).m_torrent_file.
                                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->m_info_hash);
  if (bVar9) {
    this_00 = torrent_info::orig_files
                        ((this->super_torrent_hot_members).m_torrent_file.
                         super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    iVar10 = file_storage::blocks_in_piece2(this_00,piece);
    container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>
    ::resize<int,void>((container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>
                        *)&hashes,iVar10);
  }
  iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [0x2e])();
  bVar9 = session_settings::get_bool((session_settings *)CONCAT44(extraout_var_00,iVar10),0x8016);
  pdVar4 = hashes.
           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pdVar2 = hashes.
           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (bVar9) {
    piece_picker::started_hash_job
              ((this->super_torrent_hot_members).m_picker._M_t.
               super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
               .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,piece);
    local_68._M_impl.super__Vector_impl_data._M_start =
         hashes.
         super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_68._M_impl.super__Vector_impl_data._M_finish =
         hashes.
         super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage =
         hashes.
         super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    hashes.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    hashes.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    hashes.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    digest32<160L>::clear(&local_44);
    local_b8._0_8_ = (ulong)(uint3)local_b8._5_3_ << 0x28;
    local_b8._8_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
    local_a8._0_4_ = 0xffffff;
    on_piece_verified(this,(vector<sha256_hash> *)&local_68,piece,&local_44,
                      (storage_error *)local_b8);
    ::std::_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
    ~_Vector_base(&local_68);
  }
  else {
    iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[4])();
    uVar1 = (this->m_storage).m_idx.m_val;
    ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::torrent,void>
              ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_b8,
               (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
    pdVar6 = hashes.
             super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pdVar5 = hashes.
             super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pdVar3 = hashes.
             super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_a8 = hashes.
               super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               .
               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pdStack_a0 = hashes.
                 super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 .
                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    local_98 = hashes.
               super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               .
               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    hashes.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    hashes.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    hashes.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_78 = (code *)0x0;
    pcStack_70 = (code *)0x0;
    local_88._M_unused._M_object = operator_new(0x28);
    uVar8 = local_b8._8_8_;
    uVar7 = local_b8._0_8_;
    local_b8._8_8_ = (error_category *)0x0;
    local_b8._0_8_ = 0;
    *(undefined8 *)local_88._M_unused._0_8_ = uVar7;
    *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = uVar8;
    *(pointer *)((long)local_88._M_unused._0_8_ + 0x10) = pdVar3;
    *(pointer *)((long)local_88._M_unused._0_8_ + 0x18) = pdVar5;
    *(pointer *)((long)local_88._M_unused._0_8_ + 0x20) = pdVar6;
    local_a8._0_3_ = 0;
    local_a8._3_1_ = unknown;
    local_a8._4_4_ = 0;
    pdStack_a0 = (pointer)0x0;
    local_98 = (pointer)0x0;
    pcStack_70 = ::std::
                 _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:11402:6)>
                 ::_M_invoke;
    local_78 = ::std::
               _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:11402:6)>
               ::_M_manager;
    (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar10) + 0x20))
              ((long *)CONCAT44(extraout_var_01,iVar10),uVar1,piece.m_val,pdVar2,
               (long)pdVar4 - (long)pdVar2 >> 5,cVar11,&local_88);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_88);
    verify_piece(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>)::$_0::
    ~__0((__0 *)local_b8);
    piece_picker::started_hash_job
              ((this->super_torrent_hot_members).m_picker._M_t.
               super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
               .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,piece);
    (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f])
              ();
  }
  ::std::_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
  ~_Vector_base((_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 *)&hashes);
  return;
}

Assistant:

void torrent::verify_piece(piece_index_t const piece)
	{
		TORRENT_ASSERT(m_storage);
		TORRENT_ASSERT(!m_picker->is_hashing(piece));

		// we just completed the piece, it should be flushed to disk
		disk_job_flags_t flags{};

		auto const write_mode = settings().get_int(settings_pack::disk_io_write_mode);
		if (write_mode == settings_pack::write_through)
			flags |= disk_interface::flush_piece;
		else if (write_mode == settings_pack::disable_os_cache)
			flags |= disk_interface::flush_piece | disk_interface::volatile_read;
		if (torrent_file().info_hashes().has_v1())
			flags |= disk_interface::v1_hash;

		aux::vector<sha256_hash> hashes;
		if (torrent_file().info_hashes().has_v2())
		{
			hashes.resize(torrent_file().orig_files().blocks_in_piece2(piece));
		}

		if (settings().get_bool(settings_pack::disable_hash_checks))
		{
			// short-circuit the hash check if it's disabled
			m_picker->started_hash_job(piece);
			on_piece_verified(std::move(hashes), piece, sha1_hash(), storage_error{});
			return;
		}

		span<sha256_hash> v2_span(hashes);
		m_ses.disk_thread().async_hash(m_storage, piece, v2_span, flags
			, [self = shared_from_this(), hashes1 = std::move(hashes)]
			(piece_index_t p, sha1_hash const& h, storage_error const& error) mutable
			{ self->on_piece_verified(std::move(hashes1), p, h, error); });
		m_picker->started_hash_job(piece);
		m_ses.deferred_submit_jobs();
	}